

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void luaJIT_profile_stop(lua_State *L)

{
  global_State *g_00;
  char *pcVar1;
  ulong uVar2;
  global_State *g;
  ProfileState *ps;
  lua_State *L_local;
  
  g_00 = profile_state.g;
  if ((global_State *)(L->glref).ptr64 == profile_state.g) {
    profile_timer_stop(&profile_state);
    g_00->hookmask = g_00->hookmask & 0x7f;
    lj_dispatch_update(g_00);
    g_00[5].str.num = 0;
    lj_trace_flushall(L);
    pcVar1 = profile_state.sb.b;
    uVar2 = (ulong)(uint)((int)profile_state.sb.e - (int)profile_state.sb.b);
    (g_00->gc).total = (g_00->gc).total - uVar2;
    (*g_00->allocf)(g_00->allocd,pcVar1,uVar2,0);
    profile_state.sb.e = (char *)0x0;
    profile_state.sb.w = (char *)0x0;
    profile_state.g = (global_State *)0x0;
  }
  return;
}

Assistant:

LUA_API void luaJIT_profile_stop(lua_State *L)
{
  ProfileState *ps = &profile_state;
  global_State *g = ps->g;
  if (G(L) == g) {  /* Only stop profiler if started by this VM. */
    profile_timer_stop(ps);
    g->hookmask &= ~HOOK_PROFILE;
    lj_dispatch_update(g);
#if LJ_HASJIT
    G2J(g)->prof_mode = 0;
    lj_trace_flushall(L);
#endif
    lj_buf_free(g, &ps->sb);
    ps->sb.w = ps->sb.e = NULL;
    ps->g = NULL;
  }
}